

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<fasttext::Matrix> __thiscall
fasttext::FastText::getInputMatrixFromFile(FastText *this,string *filename)

{
  byte bVar1;
  int32_t iVar2;
  invalid_argument *piVar3;
  void *this_00;
  element_type *peVar4;
  element_type *peVar5;
  DenseMatrix *__args;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  EVP_PKEY_CTX *ctx;
  element_type *in_RDI;
  shared_ptr<fasttext::Matrix> sVar6;
  size_t j_1;
  int32_t idx;
  size_t i_1;
  DenseMatrix input;
  size_t j;
  string word;
  size_t i;
  DenseMatrix mat;
  int64_t dim;
  int64_t n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  undefined4 in_stack_fffffffffffffb68;
  real in_stack_fffffffffffffb6c;
  DenseMatrix *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb80;
  int32_t in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  DenseMatrix *in_stack_fffffffffffffbb0;
  Dictionary *this_01;
  int64_t in_stack_fffffffffffffc10;
  ulong uVar7;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  Dictionary *in_stack_fffffffffffffc20;
  pointer __n;
  ulong local_3a8;
  DenseMatrix local_3a0;
  undefined1 local_341;
  string local_2a0 [39];
  undefined1 local_279;
  string local_278 [48];
  ulong local_248;
  pointer local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  Dictionary local_220 [3];
  
  this_01 = local_220;
  std::ifstream::ifstream(this_01,in_RDX,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18840b);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_279 = 1;
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffb98,
                   (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    std::invalid_argument::invalid_argument(piVar3,local_278);
    local_279 = 0;
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (void *)std::istream::operator>>(local_220,(long *)&local_240);
  std::istream::operator>>(this_00,(long *)&local_248);
  uVar7 = local_248;
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x188555);
  if (uVar7 == (long)peVar4->dim) {
    DenseMatrix::DenseMatrix
              (in_stack_fffffffffffffbb0,(int64_t)in_stack_fffffffffffffba8,
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    for (local_3a0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3a0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish < local_240;
        local_3a0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)local_3a0.data_.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 1)) {
      in_stack_fffffffffffffbb0 = &local_3a0;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffbb0);
      std::operator>>((istream *)local_220,(string *)in_stack_fffffffffffffbb0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                  in_stack_fffffffffffffb78);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x188802);
      Dictionary::add(this_01,in_RSI);
      for (local_3a8 = 0; local_3a8 < local_248; local_3a8 = local_3a8 + 1) {
        in_stack_fffffffffffffba8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DenseMatrix::at(in_stack_fffffffffffffb70,
                             CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),0x18884f)
        ;
        std::istream::operator>>(local_220,(float *)in_stack_fffffffffffffba8);
      }
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    std::ifstream::close();
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1888ee);
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              (in_stack_fffffffffffffc20,
               CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
               in_stack_fffffffffffffc10);
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188912);
    Dictionary::init(peVar5,ctx);
    peVar5 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18892d);
    iVar2 = Dictionary::nwords(peVar5);
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188948);
    __args = (DenseMatrix *)(long)(iVar2 + peVar4->bucket);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x188968);
    DenseMatrix::DenseMatrix
              (in_stack_fffffffffffffbb0,(int64_t)in_stack_fffffffffffffba8,
               CONCAT44(iVar2,in_stack_fffffffffffffba0));
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18898d);
    DenseMatrix::uniform
              ((DenseMatrix *)CONCAT44(iVar2,in_stack_fffffffffffffba0),
               (real)((ulong)__args >> 0x20));
    for (__n = (pointer)0x0; __n < local_240; __n = (pointer)((long)__n + 1)) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1889e4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_238,(size_type)__n);
      iVar2 = Dictionary::getId((Dictionary *)
                                CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                                in_stack_fffffffffffffb78);
      if (-1 < iVar2) {
        peVar5 = std::
                 __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x188a42);
        in_stack_fffffffffffffb84 = Dictionary::nwords(peVar5);
        in_stack_fffffffffffffb80 = iVar2;
        if (iVar2 < in_stack_fffffffffffffb84) {
          for (uVar7 = 0; in_stack_fffffffffffffb80 = iVar2, uVar7 < local_248; uVar7 = uVar7 + 1) {
            in_stack_fffffffffffffb78 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 DenseMatrix::at(in_stack_fffffffffffffb70,
                                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                 0x188adb);
            in_stack_fffffffffffffb6c = *(real *)in_stack_fffffffffffffb78;
            in_stack_fffffffffffffb70 =
                 (DenseMatrix *)
                 DenseMatrix::at(in_stack_fffffffffffffb70,
                                 CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                                 0x188b0e);
            *(real *)&(in_stack_fffffffffffffb70->super_Matrix)._vptr_Matrix =
                 in_stack_fffffffffffffb6c;
          }
        }
      }
    }
    std::make_shared<fasttext::DenseMatrix,fasttext::DenseMatrix>(__args);
    std::shared_ptr<fasttext::Matrix>::shared_ptr<fasttext::DenseMatrix,void>
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffb70,
               (shared_ptr<fasttext::DenseMatrix> *)
               CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x188b8e);
    DenseMatrix::~DenseMatrix(in_stack_fffffffffffffb70);
    DenseMatrix::~DenseMatrix(in_stack_fffffffffffffb70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
    std::ifstream::~ifstream(local_220);
    sVar6.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar6.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<fasttext::Matrix>)
           sVar6.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_341 = 1;
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string((long)piVar3);
  std::operator+((char *)in_stack_fffffffffffffb78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb70);
  std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1885e1);
  std::__cxx11::to_string((int)((ulong)piVar3 >> 0x20));
  std::operator+(in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  std::operator+(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
  std::invalid_argument::invalid_argument(piVar3,local_2a0);
  local_341 = 0;
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::shared_ptr<Matrix> FastText::getInputMatrixFromFile(
    const std::string& filename) const {
  std::ifstream in(filename);
  std::vector<std::string> words;
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  DenseMatrix mat(n, dim); // temp. matrix for pretrained vectors
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat.at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  DenseMatrix input(dict_->nwords() + args_->bucket, args_->dim);
  input.uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) {
      continue;
    }
    for (size_t j = 0; j < dim; j++) {
      input.at(idx, j) = mat.at(i, j);
    }
  }
  return std::make_shared<DenseMatrix>(std::move(input));
}